

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I64ToI32Lowering.cpp
# Opt level: O3

void __thiscall wasm::I64ToI32Lowering::visitUnary(I64ToI32Lowering *this,Unary *curr)

{
  UnaryOp UVar1;
  uintptr_t uVar2;
  bool bVar3;
  iterator iVar4;
  ostream *poVar5;
  Expression *local_20;
  
  if ((((ulong)curr->op < 0x34) && ((0xe478555e0002aU >> ((ulong)curr->op & 0x3f) & 1) != 0)) &&
     (bVar3 = handleUnreachable(this,(Expression *)curr), !bVar3)) {
    local_20 = curr->value;
    iVar4 = std::
            _Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::I64ToI32Lowering::TempVar>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::I64ToI32Lowering::TempVar>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&(this->highBitVars)._M_h,&local_20);
    if (((iVar4.
          super__Node_iterator_base<std::pair<wasm::Expression_*const,_wasm::I64ToI32Lowering::TempVar>,_false>
          ._M_cur == (__node_type *)0x0) &&
        (uVar2 = (curr->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression.type.id
        , uVar2 != 3)) && (uVar2 != 5)) {
      __assert_fail("hasOutParam(curr->value) || curr->type == Type::i64 || curr->type == Type::f64"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/I64ToI32Lowering.cpp"
                    ,0x3ae,"void wasm::I64ToI32Lowering::visitUnary(Unary *)");
    }
    UVar1 = curr->op;
    if ((int)UVar1 < 0x15) {
      if ((UVar1 != ClzInt64) && (UVar1 != CtzInt64)) {
        if (UVar1 == PopcntInt64) {
          handle_unreachable("i64.popcnt should already be removed",
                             "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/I64ToI32Lowering.cpp"
                             ,0x3d8);
        }
        goto switchD_008d79c0_caseD_19;
      }
      lowerCountZeros(this,curr);
    }
    else {
      switch(UVar1) {
      case EqZInt64:
        lowerEqZInt64(this,curr);
        break;
      case ExtendSInt32:
        lowerExtendSInt32(this,curr);
        break;
      case ExtendUInt32:
        lowerExtendUInt32(this,curr);
        break;
      case WrapInt64:
        lowerWrapInt64(this,curr);
        break;
      default:
switchD_008d79c0_caseD_19:
        poVar5 = std::operator<<((ostream *)&std::cerr,"Unhandled unary operator: ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,curr->op);
        std::endl<char,std::char_traits<char>>(poVar5);
        abort();
      case TruncSFloat32ToInt64:
      case TruncUFloat32ToInt64:
      case TruncSFloat64ToInt64:
      case TruncUFloat64ToInt64:
        lowerTruncFloatToInt(this,curr);
        break;
      case ReinterpretFloat64:
        lowerReinterpretFloat64(this,curr);
        break;
      case ConvertSInt64ToFloat32:
      case ConvertSInt64ToFloat64:
      case ConvertUInt64ToFloat32:
      case ConvertUInt64ToFloat64:
        lowerConvertIntToFloat(this,curr);
        break;
      case ReinterpretInt64:
        lowerReinterpretInt64(this,curr);
        break;
      case ExtendS8Int64:
      case ExtendS16Int64:
      case ExtendS32Int64:
        lowerExtendSInt64(this,curr);
      }
    }
  }
  return;
}

Assistant:

void visitUnary(Unary* curr) {
    if (!unaryNeedsLowering(curr->op)) {
      return;
    }
    if (handleUnreachable(curr)) {
      return;
    }
    assert(hasOutParam(curr->value) || curr->type == Type::i64 ||
           curr->type == Type::f64);
    switch (curr->op) {
      case ClzInt64:
      case CtzInt64:
        lowerCountZeros(curr);
        break;
      case EqZInt64:
        lowerEqZInt64(curr);
        break;
      case ExtendSInt32:
        lowerExtendSInt32(curr);
        break;
      case ExtendUInt32:
        lowerExtendUInt32(curr);
        break;
      case WrapInt64:
        lowerWrapInt64(curr);
        break;
      case ReinterpretFloat64:
        lowerReinterpretFloat64(curr);
        break;
      case ReinterpretInt64:
        lowerReinterpretInt64(curr);
        break;
      case TruncSFloat32ToInt64:
      case TruncUFloat32ToInt64:
      case TruncSFloat64ToInt64:
      case TruncUFloat64ToInt64:
        lowerTruncFloatToInt(curr);
        break;
      case ConvertSInt64ToFloat32:
      case ConvertSInt64ToFloat64:
      case ConvertUInt64ToFloat32:
      case ConvertUInt64ToFloat64:
        lowerConvertIntToFloat(curr);
        break;
      case ExtendS8Int64:
      case ExtendS16Int64:
      case ExtendS32Int64:
        lowerExtendSInt64(curr);
        break;
      case PopcntInt64:
        WASM_UNREACHABLE("i64.popcnt should already be removed");
      default:
        std::cerr << "Unhandled unary operator: " << curr->op << std::endl;
        abort();
    }
  }